

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

void do_close(uv_tcp_t *handle)

{
  undefined1 auVar1 [8];
  int iVar2;
  uv_connect_t **ppuVar3;
  uv_connect_t **ppuVar4;
  uv_tcp_t *puVar5;
  long lVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t fd;
  undefined1 auStack_90 [24];
  undefined1 auStack_78 [8];
  uv__queue uStack_70;
  uv_tcp_t *puStack_60;
  uv_connect_t *local_20;
  uv_connect_t *local_18;
  int local_c;
  
  if (shutdown_before_close == 2) {
LAB_001c9c1d:
    iVar2 = uv_fileno(handle,&local_c);
    local_18 = (uv_connect_t *)(long)iVar2;
    local_20 = (uv_connect_t *)0x0;
    if (local_18 != (uv_connect_t *)0x0) {
LAB_001c9d51:
      do_close_cold_1();
LAB_001c9d60:
      do_close_cold_7();
LAB_001c9d6f:
      do_close_cold_4();
      goto LAB_001c9d7e;
    }
    local_18 = (uv_connect_t *)(long)local_c;
    local_20 = (uv_connect_t *)0xffffffffffffffff;
    if (local_18 == (uv_connect_t *)0xffffffffffffffff) goto LAB_001c9d6f;
    iVar2 = shutdown(local_c,2);
    local_18 = (uv_connect_t *)(long)iVar2;
    local_20 = (uv_connect_t *)0x0;
    if (local_18 == (uv_connect_t *)0x0) {
      iVar2 = uv_tcp_close_reset(handle,close_cb);
      local_18 = (uv_connect_t *)(long)iVar2;
      local_20 = (uv_connect_t *)0x0;
      if (local_18 == (uv_connect_t *)0x0) goto LAB_001c9d2e;
      do_close_cold_3();
      goto LAB_001c9cd1;
    }
  }
  else {
    if (shutdown_before_close == 1) {
      iVar2 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
      local_18 = (uv_connect_t *)(long)iVar2;
      local_20 = (uv_connect_t *)0x0;
      if (local_18 == (uv_connect_t *)0x0) {
        local_18 = (uv_connect_t *)0xffffffffffffffea;
        iVar2 = uv_tcp_close_reset(handle,close_cb);
        local_20 = (uv_connect_t *)(long)iVar2;
        if (local_18 == local_20) goto LAB_001c9d2e;
        do_close_cold_6();
        goto LAB_001c9c1d;
      }
      do_close_cold_5();
      goto LAB_001c9d51;
    }
LAB_001c9cd1:
    iVar2 = uv_tcp_close_reset(handle,close_cb);
    local_18 = (uv_connect_t *)(long)iVar2;
    local_20 = (uv_connect_t *)0x0;
    if (local_18 != (uv_connect_t *)0x0) goto LAB_001c9d60;
    local_18 = (uv_connect_t *)0xffffffffffffff95;
    iVar2 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    local_20 = (uv_connect_t *)(long)iVar2;
    if (local_18 == local_20) {
LAB_001c9d2e:
      uv_close(&tcp_server,0);
      return;
    }
LAB_001c9d7e:
    do_close_cold_8();
  }
  ppuVar4 = &local_18;
  ppuVar3 = &local_20;
  do_close_cold_2();
  puVar5 = (uv_tcp_t *)ppuVar4[9];
  if (client_close == '\x01') {
    if (puVar5 == &tcp_client) goto LAB_001c9dc7;
    shutdown_cb_cold_2();
  }
  if (puVar5 == &tcp_accepted) {
LAB_001c9dc7:
    shutdown_cb_called = shutdown_cb_called + 1;
    return;
  }
  shutdown_cb_cold_1();
  if (client_close == '\x01') {
    if (puVar5 == &tcp_client) goto LAB_001c9dfb;
    close_cb_cold_2();
  }
  if (puVar5 != &tcp_accepted) {
    close_cb_cold_1();
    ppuVar4 = (uv_connect_t **)(auStack_90 + 0x10);
    puStack_60 = handle;
    if (puVar5 == (uv_tcp_t *)&connect_req) {
      auStack_90._8_8_ = (uv_loop_t *)0x1c9e42;
      uv_read_start(&tcp_client,alloc_cb,read_cb2);
      auStack_90._8_8_ = (uv_loop_t *)0x1c9e53;
      uStack_70 = (uv__queue)uv_buf_init("PING",4);
      lVar6 = 0;
      auVar1 = auStack_78;
      while( true ) {
        auStack_78 = auVar1;
        auStack_90._8_8_ = (uv_loop_t *)0x1c9e87;
        iVar2 = uv_write((long)write_reqs[0].reserved + lVar6 + -0x18,&tcp_client,&uStack_70,1,
                         write_cb);
        auStack_78 = (undefined1  [8])(long)iVar2;
        auStack_90._16_8_ = 0;
        if (auStack_78 != (undefined1  [8])0x0) break;
        lVar6 = lVar6 + 200;
        auVar1 = (undefined1  [8])(uv_close_cb)0x0;
        if (lVar6 == 800) {
          if (client_close == '\x01') {
            auStack_90._8_8_ = (uv_loop_t *)0x1c9ec6;
            do_close(&tcp_client);
          }
          return;
        }
      }
      puVar5 = (uv_tcp_t *)(auStack_90 + 0x18);
      auStack_90._8_8_ = (uv_loop_t *)0x1c9ee1;
      connect_cb_cold_2();
      ppuVar3 = ppuVar4;
    }
    auStack_90._8_8_ = read_cb2;
    connect_cb_cold_1();
    if (puVar5 == &tcp_client) {
      if (ppuVar3 == (uv_connect_t **)0xfffffffffffff001) {
        uv_close(&tcp_client,0);
        return;
      }
      return;
    }
    auStack_90._8_8_ = &tcp_client;
    auStack_90._0_8_ = write_cb;
    read_cb2_cold_1();
    auStack_90._0_8_ = SEXT48(close_cb_called);
    if ((void *)auStack_90._0_8_ == (void *)0x0) {
      puVar5 = (uv_tcp_t *)puVar5->connect_req;
      if (puVar5 == &tcp_client) {
        write_cb_called = write_cb_called + 1;
        return;
      }
    }
    else {
      puVar5 = (uv_tcp_t *)auStack_90;
      write_cb_cold_1();
    }
    write_cb_cold_2();
    iVar2 = uv_is_closing();
    if (iVar2 != 0) {
      return;
    }
    uv_close(puVar5,0);
    return;
  }
LAB_001c9dfb:
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void do_close(void* handle) {
  close_cb_called = 0;
  uv_close((uv_handle_t*)handle, close_cb);
  ASSERT_OK(close_cb_called);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, close_cb_called);
}